

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableFormatter.cpp
# Opt level: O2

void __thiscall cali::TableFormatter::TableFormatter(TableFormatter *this,QuerySpec *spec)

{
  TableImpl *this_00;
  
  (this->super_Formatter)._vptr_Formatter = (_func_int **)&PTR__TableFormatter_0028fcb0;
  this_00 = (TableImpl *)operator_new(0xc0);
  TableImpl::TableImpl(this_00);
  std::__shared_ptr<cali::TableFormatter::TableImpl,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cali::TableFormatter::TableImpl,void>
            ((__shared_ptr<cali::TableFormatter::TableImpl,(__gnu_cxx::_Lock_policy)2> *)&this->mP,
             this_00);
  TableImpl::configure
            ((this->mP).
             super___shared_ptr<cali::TableFormatter::TableImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             spec);
  return;
}

Assistant:

TableFormatter::TableFormatter(const QuerySpec& spec) : mP { new TableImpl }
{
    mP->configure(spec);
}